

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall
testing::ScopedFakeTestPartResultReporter::Init(ScopedFakeTestPartResultReporter *this)

{
  Mutex *this_00;
  TestPartResultReporterInterface *pTVar1;
  UnitTestImpl *pUVar2;
  TestPartResultReporterInterface **ppTVar3;
  ThreadLocal<testing::TestPartResultReporterInterface_*> *this_01;
  
  UnitTest::GetInstance();
  pUVar2 = UnitTest::GetInstance::instance.impl_;
  if (this->intercept_mode_ == INTERCEPT_ALL_THREADS) {
    this_00 = &(UnitTest::GetInstance::instance.impl_)->global_test_part_result_reporter_mutex_;
    internal::MutexBase::Lock(&this_00->super_MutexBase);
    pTVar1 = pUVar2->global_test_part_result_repoter_;
    internal::MutexBase::Unlock(&this_00->super_MutexBase);
    this->old_reporter_ = pTVar1;
    internal::MutexBase::Lock(&this_00->super_MutexBase);
    pUVar2->global_test_part_result_repoter_ = &this->super_TestPartResultReporterInterface;
    internal::MutexBase::Unlock(&this_00->super_MutexBase);
    return;
  }
  this_01 = &(UnitTest::GetInstance::instance.impl_)->per_thread_test_part_result_reporter_;
  ppTVar3 = internal::ThreadLocal<testing::TestPartResultReporterInterface_*>::GetOrCreateValue
                      (this_01);
  this->old_reporter_ = *ppTVar3;
  ppTVar3 = internal::ThreadLocal<testing::TestPartResultReporterInterface_*>::GetOrCreateValue
                      (this_01);
  *ppTVar3 = &this->super_TestPartResultReporterInterface;
  return;
}

Assistant:

void ScopedFakeTestPartResultReporter::Init() {
  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  if (intercept_mode_ == INTERCEPT_ALL_THREADS) {
    old_reporter_ = impl->GetGlobalTestPartResultReporter();
    impl->SetGlobalTestPartResultReporter(this);
  } else {
    old_reporter_ = impl->GetTestPartResultReporterForCurrentThread();
    impl->SetTestPartResultReporterForCurrentThread(this);
  }
}